

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::Attribute::is_value(Attribute *this)

{
  bool bVar1;
  Attribute *this_local;
  
  bVar1 = is_connection(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = is_timesamples(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = is_blocked(this);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool is_value() const {
    if (is_connection()) {
      return false;
    }

    if (is_timesamples()) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    return true;
  }